

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O3

void __thiscall OpenMD::Molecule::Molecule(Molecule *this,int globalIndex,MoleculeStamp *molStamp)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_Molecule = (_func_int **)&PTR__Molecule_002fd8e0;
  this->globalIndex_ = globalIndex;
  memset(&this->atoms_,0,0x138);
  (this->properties_)._vptr_PropertyMap = (_func_int **)&PTR__PropertyMap_002fa480;
  p_Var1 = &(this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header;
  (this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->constrainTotalCharge_ = false;
  this->molStamp_ = molStamp;
  return;
}

Assistant:

Molecule::Molecule(int globalIndex, MoleculeStamp* molStamp) :
      globalIndex_(globalIndex), molStamp_ {molStamp},
      constrainTotalCharge_(false) {}